

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O3

void duckdb::WriteLogFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  pointer pFVar1;
  LogLevel LVar2;
  ulong uVar3;
  ClientContext *client_context;
  int iVar4;
  BoundFunctionExpression *pBVar5;
  pointer pFVar6;
  reference pvVar7;
  pointer pCVar8;
  type opener;
  Logger *pLVar9;
  type db;
  InvalidInputException *this;
  ulong uVar10;
  ulong uVar11;
  UnifiedVectorFormat idata;
  LogicalType local_f0;
  Value local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  UnifiedVectorFormat local_78;
  
  pBVar5 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar5->bind_info);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::ToUnifiedFormat(pvVar7,args->count,&local_78);
  if (*(char *)&pFVar6[1]._vptr_FunctionData == '\0') {
    if (pFVar6[3]._vptr_FunctionData != (_func_int **)0x0) {
      pFVar1 = pFVar6 + 2;
      iVar4 = ::std::__cxx11::string::compare((char *)pFVar1);
      if (iVar4 != 0) {
        iVar4 = ::std::__cxx11::string::compare((char *)pFVar1);
        if (iVar4 == 0) {
          optional_ptr<duckdb::ClientContext,_true>::CheckValid
                    ((optional_ptr<duckdb::ClientContext,_true> *)(pFVar6 + 0xb));
          db = shared_ptr<duckdb::DatabaseInstance,_true>::operator*
                         ((shared_ptr<duckdb::DatabaseInstance,_true> *)
                          (pFVar6[0xb]._vptr_FunctionData + 2));
          LVar2 = *(LogLevel *)&pFVar6[6]._vptr_FunctionData;
          uVar3 = args->count;
          if (pFVar6[8]._vptr_FunctionData == (_func_int **)0x0) {
            if (uVar3 != 0) {
              uVar11 = 0;
              do {
                pLVar9 = Logger::Get(db);
                iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar2)
                ;
                if ((char)iVar4 != '\0') {
                  uVar10 = uVar11;
                  if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
                    uVar10 = (ulong)(local_78.sel)->sel_vector[uVar11];
                  }
                  Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar2,
                                   (string_t *)(local_78.data + uVar10 * 0x10));
                }
                uVar11 = uVar11 + 1;
              } while (uVar3 != uVar11);
            }
          }
          else if (uVar3 != 0) {
            uVar11 = 0;
            do {
              pLVar9 = Logger::Get(db);
              iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar2);
              if ((char)iVar4 != '\0') {
                uVar10 = uVar11;
                if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
                  uVar10 = (ulong)(local_78.sel)->sel_vector[uVar11];
                }
                Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar2,
                                 (string_t *)(local_78.data + uVar10 * 0x10));
              }
              uVar11 = uVar11 + 1;
            } while (uVar3 != uVar11);
          }
        }
        else {
          iVar4 = ::std::__cxx11::string::compare((char *)pFVar1);
          if (iVar4 != 0) {
            this = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_d8.type_._0_8_ = (long)&local_d8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,
                       "write_log: \'scope\' argument unknown: \'%s\'. Valid values are [connection, database, file_opener]"
                       ,"");
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,pFVar6[2]._vptr_FunctionData,
                       (long)pFVar6[3]._vptr_FunctionData + (long)pFVar6[2]._vptr_FunctionData);
            InvalidInputException::InvalidInputException<std::__cxx11::string>
                      (this,(string *)&local_d8,&local_98);
            __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
          }
          optional_ptr<duckdb::ClientContext,_true>::CheckValid
                    ((optional_ptr<duckdb::ClientContext,_true> *)(pFVar6 + 0xb));
          pCVar8 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::
                   operator->((unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>
                               *)(pFVar6[0xb]._vptr_FunctionData + 0x44));
          opener = unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>,_true>::
                   operator*(&pCVar8->file_opener);
          LVar2 = *(LogLevel *)&pFVar6[6]._vptr_FunctionData;
          uVar3 = args->count;
          if (pFVar6[8]._vptr_FunctionData == (_func_int **)0x0) {
            if (uVar3 != 0) {
              uVar11 = 0;
              do {
                pLVar9 = Logger::Get(opener);
                iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar2)
                ;
                if ((char)iVar4 != '\0') {
                  uVar10 = uVar11;
                  if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
                    uVar10 = (ulong)(local_78.sel)->sel_vector[uVar11];
                  }
                  Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar2,
                                   (string_t *)(local_78.data + uVar10 * 0x10));
                }
                uVar11 = uVar11 + 1;
              } while (uVar3 != uVar11);
            }
          }
          else if (uVar3 != 0) {
            uVar11 = 0;
            do {
              pLVar9 = Logger::Get(opener);
              iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar2);
              if ((char)iVar4 != '\0') {
                uVar10 = uVar11;
                if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
                  uVar10 = (ulong)(local_78.sel)->sel_vector[uVar11];
                }
                Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar2,
                                 (string_t *)(local_78.data + uVar10 * 0x10));
              }
              uVar11 = uVar11 + 1;
            } while (uVar3 != uVar11);
          }
        }
        goto LAB_00a10b83;
      }
    }
    optional_ptr<duckdb::ClientContext,_true>::CheckValid
              ((optional_ptr<duckdb::ClientContext,_true> *)(pFVar6 + 0xb));
    client_context = (ClientContext *)pFVar6[0xb]._vptr_FunctionData;
    LVar2 = *(LogLevel *)&pFVar6[6]._vptr_FunctionData;
    uVar3 = args->count;
    if (pFVar6[8]._vptr_FunctionData == (_func_int **)0x0) {
      if (uVar3 != 0) {
        uVar11 = 0;
        do {
          pLVar9 = Logger::Get(client_context);
          iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar2);
          if ((char)iVar4 != '\0') {
            uVar10 = uVar11;
            if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
              uVar10 = (ulong)(local_78.sel)->sel_vector[uVar11];
            }
            Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar2,
                             (string_t *)(local_78.data + uVar10 * 0x10));
          }
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
      }
    }
    else if (uVar3 != 0) {
      uVar11 = 0;
      do {
        pLVar9 = Logger::Get(client_context);
        iVar4 = (*pLVar9->_vptr_Logger[2])(pLVar9,pFVar6[7]._vptr_FunctionData,(ulong)LVar2);
        if ((char)iVar4 != '\0') {
          uVar10 = uVar11;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            uVar10 = (ulong)(local_78.sel)->sel_vector[uVar11];
          }
          Logger::WriteLog(pLVar9,(char *)pFVar6[7]._vptr_FunctionData,LVar2,
                           (string_t *)(local_78.data + uVar10 * 0x10));
        }
        uVar11 = uVar11 + 1;
      } while (uVar3 != uVar11);
    }
  }
LAB_00a10b83:
  if (pFVar6[0xc]._vptr_FunctionData == (_func_int **)0xffffffffffffffff) {
    LogicalType::LogicalType(&local_f0,VARCHAR);
    Value::Value(&local_d8,&local_f0);
    Vector::Reference(result,&local_d8);
    Value::~Value(&local_d8);
    LogicalType::~LogicalType(&local_f0);
  }
  else {
    pvVar7 = vector<duckdb::Vector,_true>::operator[]
                       (&args->data,(size_type)pFVar6[0xc]._vptr_FunctionData);
    Vector::Reference(result,pvVar7);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void WriteLogFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 1);

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	const auto &info = func_expr.bind_info->Cast<WriteLogBindData>();

	UnifiedVectorFormat idata;
	args.data[0].ToUnifiedFormat(args.size(), idata);

	auto input_data = UnifiedVectorFormat::GetData<string_t>(idata);

	if (!info.disable_logging) {
		if (info.scope.empty() || info.scope == "connection") {
			WriteLogValues<const ClientContext>(*info.context, info.level, input_data, idata.sel, args.size(),
			                                    info.type);
		} else if (info.scope == "database") {
			WriteLogValues<const DatabaseInstance>(*info.context->db, info.level, input_data, idata.sel, args.size(),
			                                       info.type);
		} else if (info.scope == "file_opener") {
			WriteLogValues<const FileOpener>(*info.context->client_data->file_opener, info.level, input_data, idata.sel,
			                                 args.size(), info.type);
		} else {
			throw InvalidInputException(
			    "write_log: 'scope' argument unknown: '%s'. Valid values are [connection, database, file_opener]",
			    info.scope);
		}
	}

	if (info.output_col != DConstants::INVALID_INDEX) {
		result.Reference(args.data[info.output_col]);
	} else {
		result.Reference(Value(LogicalType::VARCHAR));
	}
}